

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aspif.cpp
# Opt level: O1

void __thiscall
Potassco::AspifOutput::theoryTerm(AspifOutput *this,Id_t termId,int cId,IdSpan *args)

{
  ostream *poVar1;
  
  std::ostream::_M_insert<unsigned_long>((ulong)this->os_);
  poVar1 = this->os_;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  std::ostream::operator<<((ostream *)poVar1,2);
  poVar1 = this->os_;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  std::ostream::operator<<((ostream *)poVar1,termId);
  poVar1 = this->os_;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  std::ostream::operator<<((ostream *)poVar1,cId);
  add(this,args);
  std::__ostream_insert<char,std::char_traits<char>>(this->os_,"\n",1);
  return;
}

Assistant:

void AspifOutput::theoryTerm(Id_t termId, int cId, const IdSpan& args) {
	startDir(Directive_t::Theory).add(Theory_t::Compound).add(termId).add(cId).add(args).endDir();
}